

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::PackedArrayType::serializeTo(PackedArrayType *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 in_stack_00000140 [16];
  undefined1 in_stack_00000150 [16];
  char *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef0;
  undefined1 *__n;
  undefined1 local_e8 [32];
  int local_c8;
  void *local_c0;
  int local_b8;
  void *local_b0;
  ASTSerializer *local_a8;
  undefined4 local_98 [4];
  undefined4 local_88 [4];
  undefined8 local_78;
  undefined4 *local_70;
  char *local_68;
  undefined8 uStack_60;
  undefined4 *local_58;
  undefined4 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined4 local_2c;
  undefined4 *local_28;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined8 *local_8;
  
  local_a8 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ASTSerializer::write(in_RSI,local_b8,local_b0,in_RDI[2].field_2._M_allocated_capacity);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef0,(char *)local_a8);
  local_50 = (undefined4 *)((long)&in_RDI[2].field_2 + 8);
  local_58 = (undefined4 *)((long)&in_RDI[2].field_2 + 0xc);
  __n = local_e8;
  local_48 = "[{}:{}]";
  uStack_40 = 7;
  local_68 = "[{}:{}]";
  uStack_60 = 7;
  local_1c = *local_50;
  local_18 = local_98;
  local_28 = local_88;
  local_2c = *local_58;
  local_8 = &local_78;
  local_78 = 0x11;
  local_38 = __n;
  local_10 = local_18;
  local_98[0] = local_1c;
  local_88[0] = local_2c;
  local_70 = local_18;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000150,(format_args)in_stack_00000140);
  ASTSerializer::write(local_a8,local_c8,local_c0,(size_t)__n);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

void PackedArrayType::serializeTo(ASTSerializer& serializer) const {
    serializer.write("elementType", elementType);
    serializer.write("range", fmt::format("[{}:{}]", range.left, range.right));
}